

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::anon_unknown_0::DecorationLess::operator()
          (DecorationLess *this,Instruction *lhs,Instruction *rhs)

{
  Op OVar1;
  Op OVar2;
  bool bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  
  if ((this == (DecorationLess *)0x0) || (lhs == (Instruction *)0x0)) {
    __assert_fail("lhs && rhs",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/aggressive_dead_code_elim_pass.cpp"
                  ,0x3e,
                  "bool spvtools::opt::(anonymous namespace)::DecorationLess::operator()(const Instruction *, const Instruction *) const"
                 );
  }
  OVar1 = *(Op *)(this + 0x28);
  OVar2 = lhs->opcode_;
  if (OVar1 == OVar2) {
    uVar4 = Instruction::unique_id((Instruction *)this);
    uVar5 = Instruction::unique_id(lhs);
    return uVar4 < uVar5;
  }
  if (OVar1 == OpGroupDecorate && OVar2 != OpGroupDecorate) {
    return true;
  }
  if (OVar1 == OpGroupDecorate || OVar2 != OpGroupDecorate) {
    if (OVar1 == OpGroupMemberDecorate && OVar2 != OpGroupMemberDecorate) {
      return true;
    }
    if (OVar1 == OpGroupMemberDecorate || OVar2 != OpGroupMemberDecorate) {
      if (OVar1 == OpDecorate && OVar2 != OpDecorate) {
        return true;
      }
      if (OVar1 == OpDecorate || OVar2 != OpDecorate) {
        if (OVar1 == OpMemberDecorate && OVar2 != OpMemberDecorate) {
          return true;
        }
        if (OVar1 == OpMemberDecorate || OVar2 != OpMemberDecorate) {
          if (OVar1 == OpDecorateId && OVar2 != OpDecorateId) {
            return true;
          }
          if (OVar1 == OpDecorateId || OVar2 != OpDecorateId) {
            if (OVar1 == OpDecorateString && OVar2 != OpDecorateString) {
              return true;
            }
            if (OVar1 == OpDecorateString || OVar2 != OpDecorateString) {
              if (OVar1 == OpDecorationGroup && OVar2 != OpDecorationGroup) {
                return true;
              }
              if (OVar1 == OpDecorationGroup || OVar2 != OpDecorationGroup) {
                bVar3 = Instruction::operator<((Instruction *)this,lhs);
                return bVar3;
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool operator()(const Instruction* lhs, const Instruction* rhs) const {
    assert(lhs && rhs);
    spv::Op lhsOp = lhs->opcode();
    spv::Op rhsOp = rhs->opcode();
    if (lhsOp != rhsOp) {
#define PRIORITY_CASE(opcode)                          \
  if (lhsOp == opcode && rhsOp != opcode) return true; \
  if (rhsOp == opcode && lhsOp != opcode) return false;
      // OpGroupDecorate and OpGroupMember decorate are highest priority to
      // eliminate dead targets early and simplify subsequent checks.
      PRIORITY_CASE(spv::Op::OpGroupDecorate)
      PRIORITY_CASE(spv::Op::OpGroupMemberDecorate)
      PRIORITY_CASE(spv::Op::OpDecorate)
      PRIORITY_CASE(spv::Op::OpMemberDecorate)
      PRIORITY_CASE(spv::Op::OpDecorateId)
      PRIORITY_CASE(spv::Op::OpDecorateStringGOOGLE)
      // OpDecorationGroup is lowest priority to ensure use/def chains remain
      // usable for instructions that target this group.
      PRIORITY_CASE(spv::Op::OpDecorationGroup)
#undef PRIORITY_CASE
    }

    // Fall back to maintain total ordering (compare unique ids).
    return *lhs < *rhs;
  }